

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall kj::_::XThreadEvent::ensureDoneOrCanceled(XThreadEvent *this)

{
  uint *puVar1;
  bool bVar2;
  anon_enum_32 aVar3;
  XThreadEvent *pXVar4;
  Maybe<kj::_::XThreadEvent_&> *pMVar5;
  EventPort *pEVar6;
  long lVar7;
  Mutex *pMVar8;
  XThreadEvent **ppXVar9;
  RemoveConst<kj::_::XThreadEvent_*> *ppXVar10;
  XThreadEvent **ppXVar11;
  Executor *pEVar12;
  EventLoop *pEVar13;
  long in_FS_OFFSET;
  Locked<kj::Executor::Impl::State> lock;
  PredicateImpl impl;
  Locked<kj::Executor::Impl::State> lock_1;
  Locked<kj::Executor::Impl::State> selfLock;
  Locked<kj::Executor::Impl::State> local_a8;
  Vector<kj::_::XThreadEvent_*> local_98;
  XThreadEvent *local_78;
  State *local_70;
  Mutex *local_60;
  anon_union_16_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:959:11)>_2
  local_58;
  XThreadEvent *local_48;
  EventLoop **local_40;
  EventLoop *local_38;
  
  if (this->state != DONE) {
    pXVar4 = (XThreadEvent *)(((this->targetExecutor).ptr)->impl).ptr;
    local_98.builder.ptr = (XThreadEvent **)((ulong)local_98.builder.ptr & 0xffffffffffffff00);
    Mutex::lock((Mutex *)pXVar4);
    local_a8.ptr = (State *)&(pXVar4->super_Event).loop;
    pEVar13 = (pXVar4->super_Event).loop;
    local_a8.mutex = (Mutex *)pXVar4;
    if (pEVar13 == (EventLoop *)0x0) {
      local_98.builder.pos = &local_78;
      local_98.builder.ptr = (XThreadEvent **)&PTR_check_0038b828;
      local_60 = (Mutex *)((ulong)local_60 & 0xffffffffffffff00);
      local_98.builder.endPtr = (XThreadEvent **)local_a8.ptr;
      local_78 = this;
      Mutex::wait((Mutex *)pXVar4,&local_98);
    }
    else {
      aVar3 = this->state;
      if (aVar3 == QUEUED) {
        List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>::remove
                  ((List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink> *)
                   &(pXVar4->super_Event).next,(char *)this);
        this->state = DONE;
      }
      else if (aVar3 == EXECUTING) {
        List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>::remove
                  ((List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink> *)
                   &(pXVar4->targetExecutor).ptr,(char *)this);
        if ((this->targetLink).prev != (Maybe<kj::_::XThreadEvent_&> *)0x0) {
          throwDoubleAdd();
        }
        pMVar5 = (Maybe<kj::_::XThreadEvent_&> *)
                 ((SourceLocation *)&(local_a8.ptr)->cancel)->function;
        pMVar5->ptr = this;
        (this->targetLink).prev = pMVar5;
        ((SourceLocation *)&(local_a8.ptr)->cancel)->function = (char *)&this->targetLink;
        puVar1 = &((SourceLocation *)&(local_a8.ptr)->cancel)->lineNumber;
        *(long *)puVar1 = *(long *)puVar1 + 1;
        this->state = CANCELING;
        pEVar6 = (pEVar13->port).ptr;
        if (pEVar6 != (EventPort *)0x0) {
          (*pEVar6->_vptr_EventPort[3])();
        }
        lVar7 = *(long *)(in_FS_OFFSET + -0x20);
        if ((lVar7 == 0) || (*(long *)(lVar7 + 0x48) == 0)) {
          pEVar12 = (Executor *)0x0;
        }
        else {
          pEVar12 = *(Executor **)(lVar7 + 0x48);
        }
        if (pEVar12 == (Executor *)0x0) {
          local_98.builder.pos = &local_78;
          local_98.builder.ptr = (XThreadEvent **)&PTR_check_0038b888;
          local_98.builder.endPtr = (XThreadEvent **)local_a8.ptr;
          local_60 = (Mutex *)((ulong)local_60._1_7_ << 8);
          local_78 = this;
          Mutex::wait(local_a8.mutex,&local_98);
        }
        else {
          local_60 = (Mutex *)CONCAT71(local_60._1_7_,1);
          local_58.value.lock = &local_a8;
          local_58.value.selfExecutor = pEVar12;
          local_38 = pEVar13;
          if (this->state != DONE) {
            do {
              bVar2 = (local_a8.ptr)->waitingForCancel;
              local_98.builder.ptr = (XThreadEvent **)0x0;
              local_98.builder.pos = (RemoveConst<kj::_::XThreadEvent_*> *)0x0;
              if ((XThreadEvent *)local_a8.mutex != (XThreadEvent *)0x0) {
                Mutex::unlock(local_a8.mutex,EXCLUSIVE,(Waiter *)0x0);
              }
              local_a8.mutex = (Mutex *)local_98.builder.ptr;
              local_a8.ptr = (State *)local_98.builder.pos;
              local_98.builder.ptr = (XThreadEvent **)0x0;
              local_98.builder.pos = (RemoveConst<kj::_::XThreadEvent_*> *)0x0;
              local_98.builder.endPtr = (XThreadEvent **)0x0;
              local_98.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
              pXVar4 = (XThreadEvent *)(pEVar12->impl).ptr;
              local_78 = (XThreadEvent *)((ulong)local_78 & 0xffffffffffffff00);
              Mutex::lock((Mutex *)pXVar4,0,&local_78);
              local_40 = &(pXVar4->super_Event).loop;
              *(undefined1 *)&(pXVar4->replyLink).next.ptr = 1;
              local_48 = pXVar4;
              Executor::Impl::State::dispatchCancels((State *)local_40,&local_98);
              if (local_48 != (XThreadEvent *)0x0) {
                Mutex::unlock((Mutex *)local_48,EXCLUSIVE,(Waiter *)0x0);
              }
              Executor::Impl::processAsyncCancellations((pEVar12->impl).ptr,&local_98);
              ppXVar11 = local_98.builder.endPtr;
              ppXVar10 = local_98.builder.pos;
              ppXVar9 = local_98.builder.ptr;
              if (local_98.builder.ptr != (XThreadEvent **)0x0) {
                local_98.builder.ptr = (XThreadEvent **)0x0;
                local_98.builder.pos = (RemoveConst<kj::_::XThreadEvent_*> *)0x0;
                local_98.builder.endPtr = (XThreadEvent **)0x0;
                (*(code *)**(undefined8 **)local_98.builder.disposer)
                          (local_98.builder.disposer,ppXVar9,8,(long)ppXVar10 - (long)ppXVar9 >> 3,
                           (long)ppXVar11 - (long)ppXVar9 >> 3,0);
              }
              if (bVar2 != false) {
                sched_yield();
              }
              pXVar4 = (XThreadEvent *)(((this->targetExecutor).ptr)->impl).ptr;
              local_98.builder.ptr =
                   (XThreadEvent **)((ulong)local_98.builder.ptr & 0xffffffffffffff00);
              Mutex::lock((Mutex *)pXVar4,0,&local_98);
              local_70 = (State *)&(pXVar4->super_Event).loop;
              local_78 = pXVar4;
              if (local_a8.mutex != (Mutex *)0x0) {
                Mutex::unlock(local_a8.mutex,EXCLUSIVE,(Waiter *)0x0);
              }
              pXVar4 = local_78;
              local_a8.mutex = (Mutex *)local_78;
              local_a8.ptr = local_70;
              local_98.builder.ptr = (XThreadEvent **)&PTR_check_0038b858;
              local_98.builder.pos = &local_48;
              local_98.builder.endPtr = (XThreadEvent **)local_70;
              local_78 = (XThreadEvent *)((ulong)local_78 & 0xffffffffffffff00);
              local_48 = this;
              Mutex::wait((Mutex *)pXVar4,&local_98);
            } while (this->state != DONE);
          }
          Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++:959:11)>
          ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:959:11)>
                       *)&local_60);
          pEVar13 = local_38;
        }
      }
      else if (aVar3 == CANCELING) {
        Debug::Fault::Fault<kj::Exception::Type,char_const(&)[69]>
                  ((Fault *)&local_98,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                   ,0x403,FAILED,(char *)0x0,
                   "\"impossible state: CANCELING should only be set within the above case\"",
                   (char (*) [69])
                   "impossible state: CANCELING should only be set within the above case");
        Debug::Fault::fatal((Fault *)&local_98);
      }
    }
    if ((XThreadEvent *)local_a8.mutex != (XThreadEvent *)0x0) {
      Mutex::unlock(local_a8.mutex,EXCLUSIVE,(Waiter *)0x0);
    }
    if (pEVar13 == (EventLoop *)0x0) {
      return;
    }
  }
  pEVar12 = (this->replyExecutor).ptr;
  if ((pEVar12 != (Executor *)0x0) &&
     ((this->replyLink).prev != (Maybe<kj::_::XThreadEvent_&> *)0x0)) {
    pMVar8 = (Mutex *)(pEVar12->impl).ptr;
    local_98.builder.ptr = (XThreadEvent **)((ulong)local_98.builder.ptr & 0xffffffffffffff00);
    Mutex::lock(pMVar8,0);
    local_58.value.lock = (Locked<kj::Executor::Impl::State> *)(pMVar8 + 1);
    local_60 = pMVar8;
    List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::replyLink>::remove
              ((List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::replyLink> *)&pMVar8[3].waitersHead,
               (char *)this);
    if (local_60 != (Mutex *)0x0) {
      Mutex::unlock(local_60,EXCLUSIVE,(Waiter *)0x0);
    }
  }
  return;
}

Assistant:

void XThreadEvent::ensureDoneOrCanceled() {
  if (__atomic_load_n(&state, __ATOMIC_ACQUIRE) != DONE) {
    auto lock = targetExecutor->impl->state.lockExclusive();

    const EventLoop* loop;
    KJ_IF_SOME(l, lock->loop) {
      loop = &l;
    } else {
      // Target event loop is already dead, so we know it's already working on transitioning all
      // events to the DONE state. We can just wait.
      lock.wait([&](auto&) { return state == DONE; });
      return;
    }

    switch (state) {
      case UNUSED:
        // Nothing to do.
        break;
      case QUEUED:
        lock->start.remove(*this);
        // No wake needed since we removed work rather than adding it.
        state = DONE;
        break;
      case EXECUTING: {
        lock->executing.remove(*this);
        lock->cancel.add(*this);
        state = CANCELING;
        KJ_IF_SOME(p, loop->port) {
          p.wake();
        }

        Maybe<Executor&> maybeSelfExecutor = kj::none;
        if (threadLocalEventLoop != nullptr) {
          KJ_IF_SOME(e, threadLocalEventLoop->executor) {
            maybeSelfExecutor = *e;
          }
        }

        KJ_IF_SOME(selfExecutor, maybeSelfExecutor) {
          // If, while waiting for other threads to process our cancellation request, we have
          // cancellation requests queued back to this thread, we must process them. Otherwise,
          // we could deadlock with two threads waiting on each other to process cancellations.
          //
          // We don't have a terribly good way to detect this, except to check if the remote
          // thread is itself waiting for cancellations and, if so, wake ourselves up to check for
          // cancellations to process. This will busy-loop but at least it should eventually
          // resolve assuming fair scheduling.
          //
          // To make things extra-annoying, in order to update our waitingForCancel flag, we have
          // to lock our own executor state, but we can't take both locks at once, so we have to
          // release the other lock in the meantime.

          // Make sure we unset waitingForCancel on the way out.
          KJ_DEFER({
            lock = {};

            Vector<_::XThreadEvent*> eventsToCancelOutsideLock;
            KJ_DEFER(selfExecutor.impl->processAsyncCancellations(eventsToCancelOutsideLock));

            auto selfLock = selfExecutor.impl->state.lockExclusive();
            selfLock->waitingForCancel = false;
            selfLock->dispatchCancels(eventsToCancelOutsideLock);

            // We don't need to re-take the lock on the other executor here; it's not used again
            // after this scope.
          });

          while (state != DONE) {
            bool otherThreadIsWaiting = lock->waitingForCancel;

            // Make sure our waitingForCancel is on and dispatch any pending cancellations on this
            // thread.
            lock = {};
            {
              Vector<_::XThreadEvent*> eventsToCancelOutsideLock;
              KJ_DEFER(selfExecutor.impl->processAsyncCancellations(eventsToCancelOutsideLock));

              auto selfLock = selfExecutor.impl->state.lockExclusive();
              selfLock->waitingForCancel = true;

              // Note that we don't have to proactively delete the PromiseNodes extracted from
              // the canceled events because those nodes belong to this thread and can't possibly
              // continue executing while we're blocked here.
              selfLock->dispatchCancels(eventsToCancelOutsideLock);
            }

            if (otherThreadIsWaiting) {
              // We know the other thread was waiting for cancellations to complete a moment ago.
              // We may have just processed the necessary cancellations in this thread, in which
              // case the other thread needs a chance to receive control and notice this. Or, it
              // may be that the other thread is waiting for some third thread to take action.
              // Either way, we should yield control here to give things a chance to settle.
              // Otherwise we could end up in a tight busy loop.
#if _WIN32
              Sleep(0);
#else
              sched_yield();
#endif
            }

            // OK now we can take the original lock again.
            lock = targetExecutor->impl->state.lockExclusive();

            // OK, now we can wait for the other thread to either process our cancellation or
            // indicate that it is waiting for remote cancellation.
            lock.wait([&](const Executor::Impl::State& executorState) {
              return state == DONE || executorState.waitingForCancel;
            });
          }
        } else {
          // We have no executor of our own so we don't have to worry about cancellation cycles
          // causing deadlock.
          //
          // NOTE: I don't think we can actually get here, because it implies that this is a
          //   synchronous execution, which means there's no way to cancel it.
          lock.wait([&](auto&) { return state == DONE; });
        }
        KJ_DASSERT(!targetLink.isLinked());
        break;
      }
      case CANCELING:
        KJ_FAIL_ASSERT("impossible state: CANCELING should only be set within the above case");
      case DONE:
        // Became done while we waited for lock. Nothing to do.
        break;
    }